

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBarBuf.c
# Opt level: O2

Vec_Ptr_t * Abc_NtkToBarBufsCollect(Abc_Ntk_t *pNtk)

{
  long *plVar1;
  int iVar2;
  Vec_Ptr_t *vNodes;
  Abc_Obj_t *pAVar3;
  int iVar4;
  
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                  ,0x165,"Vec_Ptr_t *Abc_NtkToBarBufsCollect(Abc_Ntk_t *)");
  }
  if (pNtk->nBarBufs < 1) {
    __assert_fail("pNtk->nBarBufs > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                  ,0x166,"Vec_Ptr_t *Abc_NtkToBarBufsCollect(Abc_Ntk_t *)");
  }
  if (pNtk->nBarBufs != pNtk->nObjCounts[8]) {
    __assert_fail("pNtk->nBarBufs == Abc_NtkLatchNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                  ,0x167,"Vec_Ptr_t *Abc_NtkToBarBufsCollect(Abc_Ntk_t *)");
  }
  vNodes = Vec_PtrAlloc(pNtk->nObjs);
  Abc_NtkIncrementTravId(pNtk);
  for (iVar4 = 0; iVar4 < pNtk->vCis->nSize; iVar4 = iVar4 + 1) {
    pAVar3 = Abc_NtkCi(pNtk,iVar4);
    if (pNtk->vCis->nSize - pNtk->nBarBufs <= iVar4) break;
    Vec_PtrPush(vNodes,pAVar3);
    Abc_NodeSetTravIdCurrent(pAVar3);
  }
  for (iVar4 = 0; iVar2 = pNtk->vCos->nSize, iVar4 < iVar2; iVar4 = iVar4 + 1) {
    pAVar3 = Abc_NtkCo(pNtk,iVar4);
    if (pNtk->vCos->nSize - pNtk->nBarBufs <= iVar4) {
      Abc_NtkToBarBufsCollect_rec
                ((Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray],vNodes);
      Vec_PtrPush(vNodes,pAVar3);
      Vec_PtrPush(vNodes,pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanouts).pArray]);
      plVar1 = (long *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanouts).pArray];
      Vec_PtrPush(vNodes,*(void **)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                   (long)*(int *)plVar1[6] * 8));
      Abc_NodeSetTravIdCurrent(pAVar3);
      Abc_NodeSetTravIdCurrent((Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanouts).pArray])
      ;
      plVar1 = (long *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanouts).pArray];
      Abc_NodeSetTravIdCurrent
                (*(Abc_Obj_t **)
                  (*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[6] * 8));
    }
  }
  for (iVar4 = 0; iVar4 < iVar2; iVar4 = iVar4 + 1) {
    pAVar3 = Abc_NtkCo(pNtk,iVar4);
    if (pNtk->vCos->nSize - pNtk->nBarBufs <= iVar4) break;
    Abc_NtkToBarBufsCollect_rec
              ((Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray],vNodes);
    Vec_PtrPush(vNodes,pAVar3);
    Abc_NodeSetTravIdCurrent(pAVar3);
    iVar2 = pNtk->vCos->nSize;
  }
  if (vNodes->nSize == pNtk->nObjs) {
    return vNodes;
  }
  __assert_fail("Vec_PtrSize(vNodes) == Abc_NtkObjNum(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                ,0x185,"Vec_Ptr_t *Abc_NtkToBarBufsCollect(Abc_Ntk_t *)");
}

Assistant:

Vec_Ptr_t * Abc_NtkToBarBufsCollect( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj;
    int i;
    assert( Abc_NtkIsLogic(pNtk) );
    assert( pNtk->nBarBufs > 0 );
    assert( pNtk->nBarBufs == Abc_NtkLatchNum(pNtk) );
    vNodes = Vec_PtrAlloc( Abc_NtkObjNum(pNtk) );
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkForEachCi( pNtk, pObj, i )
    {
        if ( i >= Abc_NtkCiNum(pNtk) - pNtk->nBarBufs )
            break;
        Vec_PtrPush( vNodes, pObj );
        Abc_NodeSetTravIdCurrent( pObj );
    }
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        if ( i < Abc_NtkCoNum(pNtk) - pNtk->nBarBufs )
            continue;
        Abc_NtkToBarBufsCollect_rec( Abc_ObjFanin0(pObj), vNodes );
        Vec_PtrPush( vNodes, pObj );
        Vec_PtrPush( vNodes, Abc_ObjFanout0(pObj) );
        Vec_PtrPush( vNodes, Abc_ObjFanout0(Abc_ObjFanout0(pObj)) );
        Abc_NodeSetTravIdCurrent( pObj );
        Abc_NodeSetTravIdCurrent( Abc_ObjFanout0(pObj) );
        Abc_NodeSetTravIdCurrent( Abc_ObjFanout0(Abc_ObjFanout0(pObj)) );
    }
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        if ( i >= Abc_NtkCoNum(pNtk) - pNtk->nBarBufs )
            break;
        Abc_NtkToBarBufsCollect_rec( Abc_ObjFanin0(pObj), vNodes );
        Vec_PtrPush( vNodes, pObj );
        Abc_NodeSetTravIdCurrent( pObj );
    }
    assert( Vec_PtrSize(vNodes) == Abc_NtkObjNum(pNtk) );
    return vNodes;
}